

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

UserInfo * __thiscall
kj::_::NullableValue<kj::Url::UserInfo>::emplace<kj::Url::UserInfo>
          (NullableValue<kj::Url::UserInfo> *this,UserInfo *params)

{
  UserInfo *params_00;
  UserInfo *params_local;
  NullableValue<kj::Url::UserInfo> *this_local;
  
  if ((this->isSet & 1U) != 0) {
    this->isSet = false;
    dtor<kj::Url::UserInfo>(&(this->field_1).value);
  }
  params_00 = fwd<kj::Url::UserInfo>(params);
  ctor<kj::Url::UserInfo,kj::Url::UserInfo>(&(this->field_1).value,params_00);
  this->isSet = true;
  return (UserInfo *)&this->field_1;
}

Assistant:

inline T& emplace(Params&&... params) {
    if (isSet) {
      isSet = false;
      dtor(value);
    }
    ctor(value, kj::fwd<Params>(params)...);
    isSet = true;
    return value;
  }